

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nihgui.cpp
# Opt level: O0

void __thiscall VSlider::draw(VSlider *this)

{
  int iVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  undefined4 uVar5;
  undefined4 uVar6;
  undefined8 uVar7;
  uint uVar8;
  int iVar9;
  Theme *pTVar10;
  Widget *in_RDI;
  undefined4 uVar11;
  undefined4 uVar12;
  double dVar13;
  int ypos;
  double ratio;
  SaveState state;
  float bottom;
  float right;
  float top;
  float left;
  ALLEGRO_COLOR bg;
  Theme *theme;
  int in_stack_fffffffffffffb2c;
  SaveState *in_stack_fffffffffffffb30;
  undefined4 local_28;
  undefined8 uStack_20;
  
  pTVar10 = Dialog::get_theme(in_RDI->dialog);
  uVar5 = (pTVar10->fg).r;
  uStack_20._0_4_ = (pTVar10->fg).b;
  uStack_20._4_4_ = (pTVar10->fg).a;
  uVar11 = 0;
  uVar12 = 0x3fe00000;
  fVar2 = (float)in_RDI->x1 + 0.5;
  iVar9 = in_RDI->y1;
  fVar3 = (float)in_RDI->x2 + 0.5;
  fVar4 = (float)in_RDI->y2 + 0.5;
  anon_unknown.dwarf_9285::SaveState::SaveState(in_stack_fffffffffffffb30,in_stack_fffffffffffffb2c)
  ;
  uVar8 = (*in_RDI->_vptr_Widget[0x10])();
  local_28 = uVar5;
  if ((uVar8 & 1) != 0) {
    local_28 = al_map_rgb(0x40,0x40);
    uStack_20 = CONCAT44(uVar12,uVar11);
  }
  al_draw_rectangle(fVar2,(float)iVar9 + 0.5,fVar3,fVar4,local_28,uStack_20,0x3f800000);
  iVar9 = *(int *)&in_RDI->field_0x34;
  iVar1 = *(int *)&in_RDI[1]._vptr_Widget;
  dVar13 = (double)fVar4 + -0.5;
  uVar8 = Widget::height(in_RDI);
  iVar9 = (int)(dVar13 - (double)(int)(((double)iVar9 / (double)iVar1) * (double)(uVar8 - 7)));
  dVar13 = (double)fVar3 - 0.5;
  uVar6 = (pTVar10->fg).r;
  uVar7._0_4_ = (pTVar10->fg).b;
  uVar7._4_4_ = (pTVar10->fg).a;
  al_draw_filled_rectangle
            (fVar2 + 0.5,(float)(iVar9 + -5),CONCAT44((int)((ulong)dVar13 >> 0x20),(float)dVar13),
             CONCAT44(0x3fe00000,(float)iVar9),uVar6,uVar7);
  anon_unknown.dwarf_9285::SaveState::~SaveState((SaveState *)0x113cb9);
  return;
}

Assistant:

void VSlider::draw()
{
   const Theme & theme = dialog->get_theme();
   ALLEGRO_COLOR bg = theme.fg;
   float left = x1 + 0.5, top = y1 + 0.5;
   float right = x2 + 0.5, bottom = y2 + 0.5;
   SaveState state;

   if (is_disabled()) {
      bg = al_map_rgb(64, 64, 64);
   }

   al_draw_rectangle(left, top, right, bottom, bg, 1);

   double ratio = (double) this->cur_value / (double) this->max_value;
   int ypos = (int) (bottom - 0.5 - (int) (ratio * (height() - 7)));
   al_draw_filled_rectangle(left + 0.5, ypos - 5, right - 0.5, ypos, theme.fg);
}